

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O2

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_strip
          (vector<__int128,_std::allocator<__int128>_> *__return_storage_ptr__,reed_solomn *this,
          vector<__int128,_std::allocator<__int128>_> *A)

{
  pointer p_Var1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)p_Var1) >> 4;
  uVar4 = uVar3 & 0xffffffff;
  uVar2 = (int)uVar3 + 1;
  do {
    uVar4 = uVar4 - 1;
    if ((int)(uint)uVar4 < 0) {
      return __return_storage_ptr__;
    }
    uVar3 = (ulong)((uint)uVar4 & 0x7fffffff);
    uVar2 = uVar2 - 1;
  } while ((long)p_Var1[uVar3] == 0 && *(long *)((long)p_Var1 + uVar3 * 0x10 + 8) == 0);
  for (lVar5 = 0; (ulong)uVar2 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
    std::vector<__int128,_std::allocator<__int128>_>::push_back
              (__return_storage_ptr__,
               (value_type *)
               ((long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar5));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ll128> reed_solomn::poly_strip(vector<ll128> A) {
    vector<ll128> res;
    for (int i = A.size()-1; i >=0 ; --i) {
        if (A[i] !=0) {
            for (int j = 0; j <= i; ++j) {
                res.push_back(A[j]);
            }
            break;
        }
    }
    return res;
}